

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void check_ground_control(CHAR_DATA *ch,CHAR_DATA *victim,float chance,int dam)

{
  int iVar1;
  int iVar2;
  undefined1 show;
  CClass *this;
  int in_EDX;
  undefined8 in_RSI;
  CHAR_DATA *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  CHAR_DATA *unaff_retaddr;
  int in_stack_000000a4;
  bool in_stack_000000ab;
  int in_stack_000000ac;
  CHAR_DATA *in_stack_000000b0;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  float fVar4;
  float dam_type;
  
  if ((10.0 <= in_XMM0_Da) && (in_EDX != 0)) {
    iVar1 = get_skill(in_stack_000000d0,in_stack_000000cc);
    fVar3 = ((float)(iVar1 / 2) + in_XMM0_Da) / 3.0;
    iVar1 = number_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    fVar3 = fVar3 - (float)iVar1;
    if (5.0 <= fVar3) {
      fVar4 = fVar3;
      if (60.0 < fVar3) {
        fVar3 = 60.0;
        fVar4 = fVar3;
      }
    }
    else {
      fVar3 = in_stack_ffffffffffffffe0;
      fVar4 = 5.0;
    }
    iVar1 = (int)in_RDI->level;
    ch_00 = (CHAR_DATA *)(skill_table + gsn_ground_control);
    dam_type = fVar4;
    this = char_data::Class((char_data *)CONCAT44(fVar4,fVar3));
    iVar2 = CClass::GetIndex(this);
    if (*(short *)((long)&ch_00->next_in_room + (long)iVar2 * 2) <= iVar1) {
      iVar2 = number_percent();
      if ((float)iVar2 <= dam_type) {
        act((char *)CONCAT44(fVar4,fVar3),(CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
            ch_00,(void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        act((char *)CONCAT44(fVar4,fVar3),(CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
            ch_00,(void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        act((char *)CONCAT44(fVar4,fVar3),(CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
            ch_00,(void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        show = (undefined1)((uint)(in_EDX + -10) >> 0x18);
        check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
        damage_old(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)dam_type,
                   (bool)show);
        LAG_CHAR(ch_00,in_stack_ffffffffffffffcc);
      }
      else {
        check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
      }
    }
  }
  return;
}

Assistant:

void check_ground_control(CHAR_DATA *ch, CHAR_DATA *victim, float chance, int dam)
{
	if (chance < 10)
		return;

	if (dam == 0)
		return;

	chance += get_skill(ch, gsn_ground_control) / 2;
	chance /= 3;

	chance -= number_range(5, 15);
	chance = URANGE(5, chance, 60);

	if (ch->level < skill_table[gsn_ground_control].skill_level[ch->Class()->GetIndex()])
		return;

	if (number_percent() > chance)
	{
		check_improve(ch, gsn_ground_control, false, 3);
		return;
	}

	act("With brutal skill you grind $N against the ground with your weight.", ch, 0, victim, TO_CHAR);
	act("$n takes hold of $N and grinds $M against the ground.", ch, 0, victim, TO_NOTVICT);
	act("$n grinds you against the ground with brutal skill.", ch, 0, victim, TO_VICT);

	dam -= 10;

	check_improve(ch, gsn_ground_control, true, 2);
	damage_old(ch, victim, dam, gsn_ground_control, DAM_BASH, true);
	LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
}